

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

int * Abc_NtkVerifySimulatePattern(Abc_Ntk_t *pNtk,int *pModel)

{
  Abc_NtkType_t AVar1;
  uint uVar2;
  int *piVar3;
  Abc_Obj_t *pAVar4;
  long *plVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  
  AVar1 = pNtk->ntkType;
  if (AVar1 != ABC_NTK_STRASH) {
    pNtk = Abc_NtkStrash(pNtk,0,0,0);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    uVar9 = (long)pNtk->vObjs->nSize + 500;
    uVar8 = 0;
    iVar7 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar7) {
      piVar3 = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar7;
    }
    else {
      piVar3 = (int *)0x0;
    }
    uVar6 = 0;
    if (0 < iVar7) {
      uVar6 = uVar9 & 0xffffffff;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      piVar3[uVar8] = 0;
    }
    (pNtk->vTravIds).nSize = iVar7;
  }
  iVar7 = pNtk->nTravIds;
  pNtk->nTravIds = iVar7 + 1;
  if (iVar7 < 0x3fffffff) {
    pAVar4 = Abc_AigConst1(pNtk);
    pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
    for (lVar10 = 0; lVar10 < pNtk->vCis->nSize; lVar10 = lVar10 + 1) {
      pAVar4 = Abc_NtkCi(pNtk,(int)lVar10);
      pAVar4->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)pModel[lVar10];
    }
    for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
      plVar5 = (long *)Vec_PtrEntry(pNtk->vObjs,iVar7);
      if ((plVar5 != (long *)0x0) && (uVar2 = *(uint *)((long)plVar5 + 0x14), (uVar2 & 0xf) == 7)) {
        lVar10 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
        plVar5[8] = (long)(int)((uVar2 >> 0xb & 1 ^
                                *(uint *)(*(long *)(lVar10 + (long)((int *)plVar5[4])[1] * 8) + 0x40
                                         )) &
                               (uVar2 >> 10 & 1 ^
                               *(uint *)(*(long *)(lVar10 + (long)*(int *)plVar5[4] * 8) + 0x40)));
      }
    }
    uVar8 = (ulong)pNtk->vCos->nSize;
    piVar3 = (int *)malloc(uVar8 << 2);
    for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
      pAVar4 = Abc_NtkCo(pNtk,(int)lVar10);
      piVar3[lVar10] =
           *(uint *)&pAVar4->field_0x14 >> 10 & 1 ^
           *(uint *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] + 0x40);
      uVar8 = (ulong)(uint)pNtk->vCos->nSize;
    }
    if (AVar1 != ABC_NTK_STRASH) {
      Abc_NtkDelete(pNtk);
    }
    return piVar3;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int * Abc_NtkVerifySimulatePattern( Abc_Ntk_t * pNtk, int * pModel )
{
    Abc_Obj_t * pNode;
    int * pValues, Value0, Value1, i;
    int fStrashed = 0;
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash(pNtk, 0, 0, 0);
        fStrashed = 1;
    }
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)pModel[i];
    // simulate in the topological order
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Value0 = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ (int)Abc_ObjFaninC1(pNode);
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)(Value0 & Value1);
    }
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
    if ( fStrashed )
        Abc_NtkDelete( pNtk );
    return pValues;
}